

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_layer.c
# Opt level: O3

void branch_layer_forward(layer_t *l)

{
  long lVar1;
  long lVar2;
  branch_layer_t *me;
  int iVar3;
  long lVar4;
  
  if (0 < *(int *)&l[1].func) {
    lVar4 = 0;
    do {
      if (0 < l->n->batch) {
        lVar1 = *(long *)**(undefined8 **)(l[1].in.val + lVar4 * 4 + 2);
        iVar3 = 0;
        do {
          lVar2 = (long)*(int *)(lVar1 + 0x28);
          memcpy((void *)(lVar2 * iVar3 * 4 + *(long *)(lVar1 + 8)),
                 (l->in).val + (long)(int)l[1].in.val[lVar4 * 4] + (long)(l->in).size * (long)iVar3,
                 lVar2 << 2);
          iVar3 = iVar3 + 1;
        } while (iVar3 < l->n->batch);
      }
      net_forward(*(net_t **)(l[1].in.val + lVar4 * 4 + 2));
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)&l[1].func);
  }
  return;
}

Assistant:

static void branch_layer_forward(layer_t *l)
{
    int i = 0, b = 0;
    branch_layer_t *me = (branch_layer_t *)l;

    for (i = 0; i < me->num; ++i)
    {
        layer_t *branch = me->branch[i].n->layer[0];
        for (b = 0; b < l->n->batch; ++b)
            memcpy(&branch->in.val[b * branch->in.size], &l->in.val[b * l->in.size + me->branch[i].offset],
                   branch->in.size * sizeof(data_val_t));

        net_forward(me->branch[i].n);
    }
}